

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline.hpp
# Opt level: O2

void __thiscall
optimization::inlineFunc::Inline_Func::Inline_Func(Inline_Func *this,bool recursively)

{
  _Rb_tree_header *p_Var1;
  allocator<char> local_19;
  
  (this->super_MirOptimizePass)._vptr_MirOptimizePass =
       (_func_int **)&PTR_pass_name_abi_cxx11__001d93f0;
  p_Var1 = &(this->uninlineable_funcs)._M_t._M_impl.super__Rb_tree_header;
  (this->uninlineable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->uninlineable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->uninlineable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->uninlineable_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->uninlineable_funcs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->uninlined_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->uninlined_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->uninlined_funcs)._M_t._M_impl.super__Rb_tree_header;
  (this->uninlined_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->uninlined_funcs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header
  ;
  (this->uninlined_funcs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&this->name,"InlineFunction",&local_19);
  this->recursively = recursively;
  return;
}

Assistant:

Inline_Func(bool recursively = true) : recursively(recursively) {}